

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnode.cc
# Opt level: O0

void __thiscall
bdNode::msgout_connect_genmsg
          (bdNode *this,bdId *id,bdToken *transId,int msgtype,bdId *srcAddr,bdId *destAddr,int mode,
          int param,int status)

{
  int len;
  int blen;
  int avail;
  char msg [10240];
  bdId *destAddr_local;
  bdId *srcAddr_local;
  int msgtype_local;
  bdToken *transId_local;
  bdId *id_local;
  bdNode *this_local;
  
  switch(msgtype) {
  default:
    bdAccount::incCounter(&this->mAccount,9,true);
    break;
  case 0x66:
    bdAccount::incCounter(&this->mAccount,10,true);
    break;
  case 0x67:
    bdAccount::incCounter(&this->mAccount,0xb,true);
    break;
  case 0x68:
    bdAccount::incCounter(&this->mAccount,0xc,true);
  }
  registerOutgoingMsg(this,id,transId,msgtype,(bdNodeId *)0x0);
  len = bitdht_connect_genmsg
                  (transId,&this->mOwnId,msgtype,srcAddr,destAddr,mode,param,status,(char *)&blen,
                   0x27ff);
  sendPkt(this,(char *)&blen,len,id->addr);
  return;
}

Assistant:

void bdNode::msgout_connect_genmsg(bdId *id, bdToken *transId, int msgtype, bdId *srcAddr, bdId *destAddr, int mode, int param, int status) {
#ifdef DEBUG_NODE_MSGOUT
	std::cerr << "bdConnectManager::msgout_connect_genmsg() Type: " << getConnectMsgType(msgtype);
	std::cerr << " TransId: ";
	bdPrintTransId(std::cerr, transId);
	std::cerr << " To: ";
	mFns->bdPrintId(std::cerr, id);
	std::cerr << " SrcAddr: ";
	mFns->bdPrintId(std::cerr, srcAddr);
	std::cerr << " DestAddr: ";
	mFns->bdPrintId(std::cerr, destAddr);
	std::cerr << " Mode: " << mode;
	std::cerr << " Param: " << param;
	std::cerr << " Status: " << status;
	std::cerr << std::endl;
#endif

	switch(msgtype) {
		default:
		case BITDHT_MSG_TYPE_CONNECT_REQUEST:
			mAccount.incCounter(BDACCOUNT_MSG_CONNECTREQUEST, true);
			break;
		case BITDHT_MSG_TYPE_CONNECT_REPLY:
			mAccount.incCounter(BDACCOUNT_MSG_CONNECTREPLY, true);
			break;
		case BITDHT_MSG_TYPE_CONNECT_START:
			mAccount.incCounter(BDACCOUNT_MSG_CONNECTSTART, true);
			break;
		case BITDHT_MSG_TYPE_CONNECT_ACK:
			mAccount.incCounter(BDACCOUNT_MSG_CONNECTACK, true);
			break;
	}
			
	registerOutgoingMsg(id, transId, msgtype, NULL);
	
        /* create string */
        char msg[10240];
        int avail = 10240;

        int blen = bitdht_connect_genmsg(transId, &(mOwnId), msgtype, srcAddr, destAddr, mode, param, status, msg, avail-1);
        sendPkt(msg, blen, id->addr);
}